

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Config * __thiscall Catch::Session::config(Session *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  ConfigData *in_stack_00000008;
  shared_ptr<Catch::Config> *in_stack_ffffffffffffffd8;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x178));
  if (!bVar1) {
    std::make_shared<Catch::Config,Catch::ConfigData&>(in_stack_00000008);
    clara::std::shared_ptr<Catch::Config>::operator=
              ((shared_ptr<Catch::Config> *)in_RDI,in_stack_ffffffffffffffd8);
    clara::std::shared_ptr<Catch::Config>::~shared_ptr((shared_ptr<Catch::Config> *)0x134c06);
  }
  peVar2 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(in_RDI);
  return peVar2;
}

Assistant:

Config& Session::config() {
        if( !m_config )
            m_config = std::make_shared<Config>( m_configData );
        return *m_config;
    }